

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

void __thiscall
QSslSocket::setPrivateKey
          (QSslSocket *this,QString *fileName,KeyAlgorithm algorithm,EncodingFormat format,
          QByteArray *passPhrase)

{
  char cVar1;
  bool bVar2;
  QLoggingCategory *pQVar3;
  long in_FS_OFFSET;
  QSslKey key;
  QByteArray local_68;
  QSslKey local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_48,(QString *)fileName);
  cVar1 = QFile::open((QFile *)&local_48,1);
  if (cVar1 == '\0') {
    pQVar3 = QtPrivateLogging::lcSsl();
    if (((pQVar3->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      setPrivateKey((QSslSocket *)pQVar3);
    }
  }
  else {
    local_50.d.d.ptr = (QExplicitlySharedDataPointer<QSslKeyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QIODevice::readAll();
    QSslKey::QSslKey(&local_50,&local_68,algorithm,format,PrivateKey,passPhrase);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
      }
    }
    bVar2 = QSslKey::isNull(&local_50);
    if (bVar2) {
      pQVar3 = QtPrivateLogging::lcSsl();
      if (((pQVar3->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        setPrivateKey((QSslSocket *)pQVar3);
      }
    }
    else {
      QSslKey::operator=((QSslKey *)
                         (*(long *)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8 + 0x2d8
                         ),&local_50);
    }
    QSslKey::~QSslKey(&local_50);
  }
  QFile::~QFile((QFile *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocket::setPrivateKey(const QString &fileName, QSsl::KeyAlgorithm algorithm,
                               QSsl::EncodingFormat format, const QByteArray &passPhrase)
{
    QFile file(fileName);
    if (!file.open(QIODevice::ReadOnly)) {
        qCWarning(lcSsl, "QSslSocket::setPrivateKey: Couldn't open file for reading");
        return;
    }

    QSslKey key(file.readAll(), algorithm, format, QSsl::PrivateKey, passPhrase);
    if (key.isNull()) {
        qCWarning(lcSsl, "QSslSocket::setPrivateKey: "
                         "The specified file does not contain a valid key");
        return;
    }

    Q_D(QSslSocket);
    d->configuration.privateKey = key;
}